

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

bool QUtil::pdf_time_to_iso8601(string *pdf_time,string *iso8601)

{
  bool bVar1;
  QPDFTime *qtm_00;
  QPDFTime qtm;
  QPDFTime local_54;
  string local_38;
  
  bVar1 = pdf_time_to_qpdf_time(pdf_time,&local_54);
  if (bVar1) {
    qpdf_time_to_iso8601_abi_cxx11_(&local_38,(QUtil *)&local_54,qtm_00);
    std::__cxx11::string::operator=((string *)iso8601,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

bool
QUtil::pdf_time_to_iso8601(std::string const& pdf_time, std::string& iso8601)
{
    QPDFTime qtm;
    if (pdf_time_to_qpdf_time(pdf_time, &qtm)) {
        iso8601 = qpdf_time_to_iso8601(qtm);
        return true;
    }
    return false;
}